

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O0

void __thiscall entities::Label::Label(Label *this,Chunk *chunk,uint tileIndex,Label *rhs)

{
  LodRenderer *coords;
  LodRenderer *pLVar1;
  Drawable *drawable;
  uint in_EDX;
  Chunk *in_RSI;
  LodRenderer *in_RDI;
  Text *in_stack_ffffffffffffffd0;
  uint tileIndex_00;
  
  Entity::Entity((Entity *)in_RDI,in_RSI,in_EDX);
  sf::Drawable::Drawable
            ((Drawable *)
             &(in_RDI->decorations_).vec_.
              super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  in_RDI->_vptr_LodRenderer = (_func_int **)&PTR__Label_00493598;
  (in_RDI->decorations_).vec_.
  super__Vector_base<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>,_std::allocator<std::pair<unsigned_long,_FlatMap<unsigned_int,_const_sf::Drawable_*,_std::less<unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_004935d0;
  sf::Text::Text(in_stack_ffffffffffffffd0,(Text *)&(in_RDI->decorations_).field_0x18);
  spdlog::debug<char[38]>((char (*) [38])0x282a8c);
  coords = Chunk::getLodRenderer(in_RSI);
  if (coords != (LodRenderer *)0x0) {
    pLVar1 = Chunk::getLodRenderer(in_RSI);
    tileIndex_00 = (uint)((ulong)pLVar1 >> 0x20);
    drawable = (Drawable *)Chunk::getCoords(in_RSI);
    LodRenderer::addDecoration(in_RDI,(repr)coords,tileIndex_00,drawable);
  }
  return;
}

Assistant:

Label::Label(Chunk& chunk, unsigned int tileIndex, const Label& rhs) :
    Entity(chunk, tileIndex),
    text_(rhs.text_) {

    spdlog::debug("Label entity (copy) has been created.");
    if (chunk.getLodRenderer() != nullptr) {
        chunk.getLodRenderer()->addDecoration(chunk.getCoords(), tileIndex, this);
    }
}